

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

Bool prvTidyFindTag(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Dict *pDVar2;
  TidyOptionImpl *opt;
  
  if (*(int *)((doc->config).value + 0x67) == 0) {
    if ((node->element == (ctmbstr)0x0) ||
       (pDVar2 = tagsLookup(doc,&doc->tags,node->element), pDVar2 == (Dict *)0x0)) {
      BVar1 = prvTidynodeIsAutonomousCustomTag(doc,node);
      if (BVar1 != no) {
        opt = prvTidygetOption(TidyCustomTags);
        prvTidyDeclareUserTag(doc,opt,node->element);
        pDVar2 = tagsLookup(doc,&doc->tags,node->element);
        node->tag = pDVar2;
        prvTidyReport(doc,node,node,0x234);
        return yes;
      }
      return no;
    }
  }
  else {
    pDVar2 = (doc->tags).xml_tags;
  }
  node->tag = pDVar2;
  return yes;
}

Assistant:

Bool TY_(FindTag)( TidyDocImpl* doc, Node *node )
{
    const Dict *np = NULL;

    if ( cfgBool(doc, TidyXmlTags) )
    {
        node->tag = doc->tags.xml_tags;
        return yes;
    }

    if ( node->element && (np = tagsLookup(doc, &doc->tags, node->element)) )
    {
        node->tag = np;
        return yes;
    }
    
    /* Add autonomous custom tag. This can be done in both HTML5 mode and
       earlier, although if it's earlier we will complain about it elsewhere. */
    if ( TY_(nodeIsAutonomousCustomTag)( doc, node) )
    {
        const TidyOptionImpl* opt = TY_(getOption)( TidyCustomTags );

        TY_(DeclareUserTag)( doc, opt, node->element );
        node->tag = tagsLookup(doc, &doc->tags, node->element);

        /* Output a message the first time we encounter an autonomous custom 
           tag. This applies despite the HTML5 mode. */
        TY_(Report)(doc, node, node, CUSTOM_TAG_DETECTED);

        return yes;
    }
    
    return no;
}